

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void prevector_tests::PrevectorTestInt_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_6e8;
  pointer local_6e0;
  char *local_6d8;
  char *local_6d0;
  pointer local_6c8;
  pointer local_6c0;
  char *local_6b8;
  char *local_6b0;
  pointer local_6a8;
  pointer local_6a0;
  char *local_698;
  char *local_690;
  pointer local_688;
  pointer local_680;
  char *local_678;
  char *local_670;
  pointer local_668;
  pointer local_660;
  char *local_658;
  char *local_650;
  basic_wrap_stringstream<char> local_648;
  PrevectorTestInt t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/prevector_tests.cpp"
  ;
  local_650 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"PrevectorTestInt");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_668 = (pbVar3->_M_dataplus)._M_p;
  local_660 = local_668 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0xd8;
  file.m_begin = (iterator)&local_658;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_668,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  PrevectorTestInt::PrevectorTestInt(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/prevector_tests.cpp"
  ;
  local_670 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"PrevectorTestInt");
  std::operator<<((ostream *)&local_648,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_688 = (pbVar3->_M_dataplus)._M_p;
  local_680 = local_688 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0xd8;
  file_00.m_begin = (iterator)&local_678;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_688,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_698 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/prevector_tests.cpp"
  ;
  local_690 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"PrevectorTestInt");
  std::operator<<((ostream *)&local_648,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6a8 = (pbVar3->_M_dataplus)._M_p;
  local_6a0 = local_6a8 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0xd8;
  file_01.m_begin = (iterator)&local_698;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6a8,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  PrevectorTestInt::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/prevector_tests.cpp"
  ;
  local_6b0 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"PrevectorTestInt");
  std::operator<<((ostream *)&local_648,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6c8 = (pbVar3->_M_dataplus)._M_p;
  local_6c0 = local_6c8 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0xd8;
  file_02.m_begin = (iterator)&local_6b8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6c8,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/prevector_tests.cpp"
  ;
  local_6d0 = "";
  memset(&local_648,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_648);
  std::operator<<((ostream *)&local_648,'\"');
  std::operator<<((ostream *)&local_648,"PrevectorTestInt");
  std::operator<<((ostream *)&local_648,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_648);
  local_6e8 = (pbVar3->_M_dataplus)._M_p;
  local_6e0 = local_6e8 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0xd8;
  file_03.m_begin = (iterator)&local_6d8;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_6e8,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_648);
  ChainTestingSetup::~ChainTestingSetup((ChainTestingSetup *)&t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(PrevectorTestInt)
{
    for (int j = 0; j < 64; j++) {
        prevector_tester<8, int> test{m_rng};
        for (int i = 0; i < 2048; i++) {
            if (m_rng.randbits(2) == 0) {
                test.insert(m_rng.randrange(test.size() + 1), int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(2) == 1) {
                test.erase(m_rng.randrange(test.size()));
            }
            if (m_rng.randbits(3) == 2) {
                int new_size = std::max(0, std::min(30, (int)test.size() + (int)m_rng.randrange(5) - 2));
                test.resize(new_size);
            }
            if (m_rng.randbits(3) == 3) {
                test.insert(m_rng.randrange(test.size() + 1), 1 + m_rng.randbool(), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 4) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbool()));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(4) == 5) {
                test.push_back(int(m_rng.rand32()));
            }
            if (test.size() > 0 && m_rng.randbits(4) == 6) {
                test.pop_back();
            }
            if (m_rng.randbits(5) == 7) {
                int values[4];
                int num = 1 + (m_rng.randbits(2));
                for (int k = 0; k < num; k++) {
                    values[k] = int(m_rng.rand32());
                }
                test.insert_range(m_rng.randrange(test.size() + 1), values, values + num);
            }
            if (m_rng.randbits(5) == 8) {
                int del = std::min<int>(test.size(), 1 + (m_rng.randbits(2)));
                int beg = m_rng.randrange(test.size() + 1 - del);
                test.erase(beg, beg + del);
            }
            if (m_rng.randbits(5) == 9) {
                test.reserve(m_rng.randbits(5));
            }
            if (m_rng.randbits(6) == 10) {
                test.shrink_to_fit();
            }
            if (test.size() > 0) {
                test.update(m_rng.randrange(test.size()), int(m_rng.rand32()));
            }
            if (m_rng.randbits(10) == 11) {
                test.clear();
            }
            if (m_rng.randbits(9) == 12) {
                test.assign(m_rng.randbits(5), int(m_rng.rand32()));
            }
            if (m_rng.randbits(3) == 3) {
                test.swap();
            }
            if (m_rng.randbits(4) == 8) {
                test.copy();
            }
            if (m_rng.randbits(5) == 18) {
                test.move();
            }
            if (m_rng.randbits(5) == 19) {
                unsigned int num = 1 + (m_rng.randbits(4));
                std::vector<int> values(num);
                for (int& v : values) {
                    v = int(m_rng.rand32());
                }
                test.resize_uninitialized(values);
            }
        }
    }
}